

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::DynamicMapField::Swap(DynamicMapField *this,MapFieldBase *other)

{
  State SVar1;
  RepeatedPtrField<google::protobuf::Message> *pRVar2;
  DynamicMapField *pDVar3;
  
  pDVar3 = down_cast<google::protobuf::internal::DynamicMapField*,google::protobuf::internal::MapFieldBase>
                     (other);
  pRVar2 = (this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.repeated_field_;
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase.repeated_field_ =
       (pDVar3->
       super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
       super_MapFieldBase.repeated_field_;
  (pDVar3->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase.repeated_field_ = pRVar2;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::swap(&this->map_,&pDVar3->map_);
  SVar1 = (pDVar3->
          super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
          super_MapFieldBase.state_._M_i;
  (pDVar3->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase.state_._M_i =
       (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
       ).super_MapFieldBase.state_._M_i;
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase.state_._M_i = SVar1;
  return;
}

Assistant:

void DynamicMapField::Swap(MapFieldBase* other) {
  DynamicMapField* other_field = down_cast<DynamicMapField*>(other);
  std::swap(this->MapFieldBase::repeated_field_, other_field->repeated_field_);
  map_.swap(other_field->map_);
  // a relaxed swap of the atomic
  auto other_state = other_field->state_.load(std::memory_order_relaxed);
  auto this_state = this->MapFieldBase::state_.load(std::memory_order_relaxed);
  other_field->state_.store(this_state, std::memory_order_relaxed);
  this->MapFieldBase::state_.store(other_state, std::memory_order_relaxed);
}